

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

bool redo_cmd_active_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  bool bVar2;
  Am_Object undo_handler;
  Am_Object last_command;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  local_28.data = (Am_Object_Data *)0x0;
  local_20.data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_18,self);
  GV_undo_handler_from_cmd(&local_10);
  Am_Object::operator=(&local_28,&local_10);
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&local_18);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    in_value = Am_Object::Get(&local_28,0x179,0);
    Am_Object::operator=(&local_20,in_value);
    bVar1 = Am_Object::Valid(&local_20);
    bVar2 = true;
    if (bVar1) goto LAB_00240139;
  }
  bVar2 = false;
LAB_00240139:
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_28);
  return bVar2;
}

Assistant:

Am_Define_Formula(bool, redo_cmd_active)
{
  Am_Object undo_handler, last_command;
  undo_handler = GV_undo_handler_from_cmd(self);
  if (undo_handler.Valid()) {
    last_command = undo_handler.Get(Am_REDO_ALLOWED);
    if (last_command.Valid())
      return true;
  }
  return false;
}